

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsTTDReplayExecution(JsTTDMoveMode *moveMode,int64_t *rootEventTime)

{
  ThreadContext *pTVar1;
  EventLog *this;
  ExecutionInfoManager *this_00;
  JsrtContext *pJVar2;
  AutoNestedHandledExceptionType local_58 [2];
  TTDebuggerAbortException abortException;
  
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    TTDAbort_unrecoverable_error("This shouldn\'t happen!!!");
  }
  pTVar1 = ((((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
           threadContext;
  this = pTVar1->TTDLog;
  if (this != (EventLog *)0x0) {
    this_00 = pTVar1->TTDExecutionInfo;
    if (this_00 != (ExecutionInfoManager *)0x0) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      if ((*moveMode & JsTTDMoveBreakOnEntry) != JsTTDMoveNone) {
        TTD::ExecutionInfoManager::SetBreakOnFirstUserCode(this_00);
      }
      TTD::ExecutionInfoManager::SetActiveBPInfoAsNeeded(this_00,pTVar1->TTDContext);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    }
    *moveMode = JsTTDMoveNone;
    *rootEventTime = -1;
    TTD::EventLog::ReplayRootEventsToTime(this,0x7fffffffffffffff);
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDReplayExecution(_Inout_ JsTTDMoveMode* moveMode, _Out_ int64_t* rootEventTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    TTDAssert(cCheck == JsNoError, "This shouldn't happen!!!");

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    ThreadContext* threadContext = scriptContext->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    TTD::EventLog* elog = threadContext->TTDLog;
    TTD::ExecutionInfoManager* emanager = threadContext->TTDExecutionInfo;

    if(emanager != nullptr)
    {
        JsErrorCode bpstatus = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            if((*moveMode & JsTTDMoveMode::JsTTDMoveBreakOnEntry) == JsTTDMoveMode::JsTTDMoveBreakOnEntry)
            {
                emanager->SetBreakOnFirstUserCode();
            }

            //Set the active BP info from the manager (so we will hit the BP in step back operations)
            emanager->SetActiveBPInfoAsNeeded(threadContext->TTDContext);

            return JsNoError;
        });

        if(bpstatus != JsNoError)
        {
            return bpstatus;
        }
    }

    *moveMode = JsTTDMoveMode::JsTTDMoveNone;
    *rootEventTime = -1;
    JsErrorCode res = JsNoError;
    try
    {
        elog->ReplayRootEventsToTime(TTD_EVENT_MAXTIME);
    }
    catch(TTD::TTDebuggerAbortException abortException)
    {
        //if the debugger bails out with a move time request set info on the requested event time here
        //rest of breakpoint info should have been set by the debugger callback before aborting
        if (abortException.IsEventTimeMove() || abortException.IsTopLevelException())
        {
            *moveMode = (JsTTDMoveMode)abortException.GetMoveMode();
            *rootEventTime = abortException.GetTargetEventTime();

            //Check if we are tracking execution and, if so, set the exception location so we can access it later
            if(emanager != nullptr && abortException.IsTopLevelException())
            {
                emanager->SetPendingTTDUnhandledException();
            }
        }

        res = abortException.IsTopLevelException() ? JsErrorCategoryScript : JsNoError;
    }
    catch(...)
    {
        res = JsErrorFatal;
        TTDAssert(false, "Unexpected fatal Error");
    }

    return res;
#endif
}